

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLDocument::Parse(XMLDocument *this)

{
  char *pcVar1;
  char *p;
  XMLDocument *this_local;
  
  this->_parseCurLineNum = 1;
  (this->super_XMLNode)._parseLineNum = 1;
  pcVar1 = XMLUtil::SkipWhiteSpace(this->_charBuffer,&this->_parseCurLineNum);
  pcVar1 = XMLUtil::ReadBOM(pcVar1,&this->_writeBOM);
  if (*pcVar1 == '\0') {
    SetError(this,XML_ERROR_EMPTY_DOCUMENT,0,(char *)0x0);
  }
  else {
    (*(this->super_XMLNode)._vptr_XMLNode[0x11])(this,pcVar1,0,&this->_parseCurLineNum);
  }
  return;
}

Assistant:

void XMLDocument::Parse()
{
    TIXMLASSERT( NoChildren() ); // Clear() must have been called previously
    TIXMLASSERT( _charBuffer );
    _parseCurLineNum = 1;
    _parseLineNum = 1;
    char* p = _charBuffer;
    p = XMLUtil::SkipWhiteSpace( p, &_parseCurLineNum );
    p = const_cast<char*>( XMLUtil::ReadBOM( p, &_writeBOM ) );
    if ( !*p ) {
        SetError( XML_ERROR_EMPTY_DOCUMENT, 0, 0 );
        return;
    }
    ParseDeep(p, 0, &_parseCurLineNum );
}